

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_update_ghost_dir(Integer g_a,Integer pdim,Integer pdir,logical pflag)

{
  long lVar1;
  Integer *pIVar2;
  short sVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  C_Integer *pCVar7;
  char *pcVar8;
  global_array_t *pgVar9;
  int iVar10;
  Integer proc;
  logical lVar11;
  ulong *proclist;
  long lVar12;
  Integer IVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  C_Integer CVar20;
  long lVar21;
  size_t sVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int _ndim;
  Integer np;
  int _index [7];
  Integer _hi [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  char err_string [256];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  Integer lmask [7];
  Integer mask [7];
  int local_5f0;
  long local_5b8;
  ulong local_5b0;
  int local_5a4;
  int local_5a0;
  uint local_59c;
  int local_598 [8];
  long local_578;
  long local_570;
  long local_568;
  Integer *local_560;
  long local_558;
  logical local_550;
  long local_548 [8];
  size_t local_508;
  long local_500;
  Integer local_4f8;
  long local_4f0;
  long local_4e8;
  ulong local_4e0;
  long local_4d8;
  char **local_4d0;
  Integer local_4c8 [8];
  Integer local_488 [8];
  long local_448 [8];
  int local_408 [8];
  int local_3e8 [8];
  int local_3c8 [8];
  long local_3a8;
  undefined7 uStack_3a0;
  undefined1 uStack_399;
  undefined7 uStack_398;
  long alStack_2a8 [8];
  Integer local_268 [8];
  Integer local_228 [8];
  long alStack_1e8 [8];
  long local_1a8 [8];
  long local_168 [7];
  long alStack_130 [9];
  long local_e8 [8];
  long local_a8 [8];
  Integer aIStack_68 [7];
  
  local_550 = pflag;
  local_4f8 = pdir;
  proc = pnga_nodeid();
  iVar15 = _ga_sync_end;
  iVar18 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  lVar11 = pnga_has_ghosts(g_a);
  if (lVar11 != 0) {
    local_5a4 = iVar15;
    lVar1 = g_a + 1000;
    lVar31 = (long)GA[lVar1].p_handle;
    if (iVar18 != 0) {
      pnga_pgroup_sync(lVar31);
    }
    pgVar9 = GA;
    local_5a0 = GA[lVar1].elemsize;
    sVar3 = GA[lVar1].ndim;
    lVar30 = (long)sVar3;
    local_558 = lVar31;
    if (0 < lVar30) {
      memcpy(local_448,GA[g_a + 1000].width,lVar30 * 8);
      memcpy(local_e8,pgVar9[g_a + 1000].dims,lVar30 * 8);
      lVar16 = 0;
      lVar31 = 0;
      do {
        uVar23 = (ulong)pgVar9[lVar1].nblock[lVar16];
        local_5b0 = 0;
        lVar12 = lVar31;
        if (0 < (long)uVar23) {
          lVar12 = lVar31 + uVar23;
          local_5b0 = 0;
          do {
            if (local_5b0 < pgVar9[lVar1].nblock[lVar16] - 1) {
              if ((pgVar9[lVar1].mapc[lVar31 + 1] - pgVar9[lVar1].mapc[lVar31]) + 1 <
                  local_448[lVar16]) {
                return 0;
              }
            }
            else if ((pgVar9[lVar1].dims[lVar16] - pgVar9[lVar1].mapc[lVar31]) + 1 <
                     local_448[lVar16]) {
              return 0;
            }
            lVar31 = lVar31 + 1;
            local_5b0 = local_5b0 + 1;
          } while (uVar23 != local_5b0);
        }
        lVar16 = lVar16 + 1;
        lVar31 = lVar12;
      } while (lVar16 != lVar30);
    }
    sVar22 = GAnproc * 0x70 | 8;
    local_560 = (Integer *)malloc(sVar22);
    if (local_560 == (Integer *)0x0) {
      pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
      sVar22 = GAnproc * 0x70 | 8;
    }
    proclist = (ulong *)malloc(sVar22);
    if (proclist == (ulong *)0x0) {
      pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);
    }
    pnga_distribution(g_a,proc,local_228,local_268);
    lVar31 = lVar30 + -1;
    lVar16 = 1;
    if ((local_550 != 0) && (lVar12 = lVar31, 1 < sVar3)) {
      do {
        lVar16 = lVar16 * 3;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    lVar12 = pdim + -1;
    local_5f0 = (int)proc;
    local_570 = (long)local_5f0;
    local_508 = lVar30 * 8 - 8;
    local_4f0 = lVar16 + (ulong)(lVar16 == 0);
    local_578 = g_a * 0x368 + 0xd5068;
    local_568 = g_a * 0x368 + 0xd4f00;
    local_5b8 = 0;
    local_4e8 = lVar12;
    local_500 = lVar31;
    do {
      if (local_550 == 0) {
        if (sVar3 < 2) goto LAB_00191ddf;
        memset(local_a8,0,local_508);
LAB_00191de9:
        lVar16 = 0;
        lVar24 = 0;
        do {
          IVar13 = local_4f8;
          if (lVar12 != lVar16) {
            pIVar2 = local_a8 + lVar24;
            lVar24 = lVar24 + 1;
            IVar13 = *pIVar2;
          }
          aIStack_68[lVar16] = IVar13;
          lVar16 = lVar16 + 1;
        } while (lVar30 != lVar16);
        if (0 < sVar3) {
          lVar16 = 0;
          do {
            lVar12 = aIStack_68[lVar16];
            if (lVar12 == -1) {
              lVar12 = local_228[lVar16];
              if (1 < lVar12) {
                local_488[lVar16] = lVar12 - local_448[lVar16];
                lVar12 = lVar12 + -1;
                goto LAB_00191ee7;
              }
              local_4c8[lVar16] = local_e8[lVar16];
              local_488[lVar16] = (local_e8[lVar16] - local_448[lVar16]) + 1;
            }
            else {
              if (lVar12 == 1) {
                lVar12 = local_268[lVar16];
                if (lVar12 < local_e8[lVar16]) {
                  local_488[lVar16] = lVar12 + 1;
                  lVar12 = lVar12 + local_448[lVar16];
                }
                else {
                  local_488[lVar16] = 1;
                  lVar12 = local_448[lVar16];
                }
              }
              else {
                if (lVar12 != 0) {
                  pnga_update_ghost_dir_cold_1();
                  goto LAB_00191eef;
                }
                local_488[lVar16] = local_228[lVar16];
                lVar12 = local_268[lVar16];
              }
LAB_00191ee7:
              local_4c8[lVar16] = lVar12;
            }
LAB_00191eef:
            lVar16 = lVar16 + 1;
          } while (lVar30 != lVar16);
        }
      }
      else {
        if (1 < sVar3) {
          lVar24 = 0;
          lVar16 = local_5b8;
          do {
            local_a8[lVar24] = ~((lVar16 / 3) * 3) + lVar16;
            lVar24 = lVar24 + 1;
            lVar16 = lVar16 / 3;
          } while (lVar31 != lVar24);
        }
LAB_00191ddf:
        if (0 < sVar3) goto LAB_00191de9;
      }
      lVar11 = pnga_locate_region(g_a,local_488,local_4c8,local_560,(Integer *)proclist,
                                  (Integer *)&local_5b0);
      if (lVar11 == 0) {
        local_3a8._0_1_ = 'c';
        local_3a8._1_1_ = 'a';
        local_3a8._2_1_ = 'n';
        local_3a8._3_1_ = 'n';
        local_3a8._4_1_ = 'o';
        local_3a8._5_1_ = 't';
        local_3a8._6_1_ = ' ';
        local_3a8._7_1_ = 'l';
        uStack_3a0 = 0x7220657461636f;
        uStack_399 = 0x65;
        uStack_398 = 0x203a6e6f6967;
        strcpy((char *)((long)&uStack_398 + 6),GA[lVar1].name);
        sVar22 = strlen((char *)&local_3a8);
        sprintf((char *)((long)&local_3a8 + (long)(int)sVar22)," [%ld:%ld ",local_488[0],
                local_4c8[0]);
        sVar22 = strlen((char *)&local_3a8);
        iVar18 = (int)sVar22;
        IVar13 = pnga_ndim(g_a);
        if (1 < IVar13) {
          lVar31 = 1;
          do {
            sprintf((char *)((long)&local_3a8 + (long)(int)sVar22),",%ld:%ld ",local_488[lVar31],
                    local_4c8[lVar31]);
            sVar22 = strlen((char *)&local_3a8);
            iVar18 = (int)sVar22;
            lVar31 = lVar31 + 1;
            IVar13 = pnga_ndim(g_a);
          } while (lVar31 < IVar13);
        }
        *(undefined2 *)((long)&local_3a8 + (long)iVar18) = 0x5d;
        pnga_error((char *)&local_3a8,g_a);
        lVar31 = local_500;
      }
      if (1 < (long)local_5b0) {
        pnga_update_ghost_dir_cold_2();
      }
      uVar23 = *proclist;
      pnga_distribution(g_a,uVar23,local_488,local_4c8);
      pgVar9 = GA;
      if (0 < sVar3) {
        lVar16 = 0;
        do {
          lVar12 = aIStack_68[lVar16];
          if (lVar12 == -1) {
            alStack_2a8[lVar16] = 0;
            alStack_1e8[lVar16] = local_448[lVar16] + -1;
            lVar12 = (local_4c8[lVar16] - local_488[lVar16]) + 1;
LAB_0019213d:
            alStack_130[lVar16 + 1] = lVar12;
          }
          else {
            if (lVar12 == 1) {
              lVar12 = local_448[lVar16];
              alStack_2a8[lVar16] = lVar12 + (local_268[lVar16] - local_228[lVar16]) + 1;
              lVar24 = (local_268[lVar16] - local_228[lVar16]) + lVar12 * 2;
LAB_00192101:
              alStack_1e8[lVar16] = lVar24;
              goto LAB_0019213d;
            }
            if (lVar12 == 0) {
              lVar12 = local_448[lVar16];
              alStack_2a8[lVar16] = lVar12;
              lVar24 = (local_268[lVar16] + lVar12) - local_228[lVar16];
              goto LAB_00192101;
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar30 != lVar16);
      }
      uVar4 = GA[lVar1].ndim;
      uVar28 = (ulong)(short)uVar4;
      uVar5 = GA[lVar1].distr_type;
      local_59c = uVar5 - 1;
      local_4e0 = (ulong)uVar5;
      if (local_59c < 3) {
        lVar16 = GA[lVar1].num_blocks[0];
        lVar12 = local_570 % lVar16;
        local_598[0] = (int)lVar12;
        if (1 < (short)uVar4) {
          lVar24 = 0;
          IVar13 = proc;
          do {
            IVar13 = (long)((int)IVar13 - (int)lVar12) / lVar16;
            lVar16 = GA[g_a + 1000].num_blocks[lVar24 + 1];
            lVar12 = (long)(int)IVar13 % lVar16;
            local_598[lVar24 + 1] = (int)lVar12;
            lVar24 = lVar24 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar24);
        }
        if (0 < (short)uVar4) {
          lVar16 = 0;
          do {
            iVar18 = *(int *)((long)local_598 + lVar16);
            lVar12 = *(long *)((long)GA->dims + lVar16 * 2 + local_578 + -0x30);
            *(long *)((long)&local_3a8 + lVar16 * 2) = lVar12 * iVar18 + 1;
            lVar12 = ((long)iVar18 + 1) * lVar12;
            lVar24 = *(long *)((long)GA + lVar16 * 2 + local_578 + -0x1f8);
            if (lVar24 <= lVar12) {
              lVar12 = lVar24;
            }
            *(long *)((long)local_548 + lVar16 * 2) = lVar12;
            lVar16 = lVar16 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar16);
        }
      }
      else if (uVar5 == 4) {
        lVar16 = GA[lVar1].num_blocks[0];
        lVar12 = local_570 % lVar16;
        local_598[0] = (int)lVar12;
        if (1 < (short)uVar4) {
          lVar24 = 0;
          IVar13 = proc;
          do {
            IVar13 = (long)((int)IVar13 - (int)lVar12) / lVar16;
            lVar16 = GA[g_a + 1000].num_blocks[lVar24 + 1];
            lVar12 = (long)(int)IVar13 % lVar16;
            local_598[lVar24 + 1] = (int)lVar12;
            lVar24 = lVar24 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar24);
        }
        if (0 < (short)uVar4) {
          pCVar7 = GA[lVar1].mapc;
          lVar16 = 0;
          iVar18 = 0;
          do {
            iVar15 = *(int *)((long)local_598 + lVar16);
            lVar24 = (long)iVar18 + (long)iVar15;
            *(C_Integer *)((long)&local_3a8 + lVar16 * 2) = pCVar7[lVar24];
            lVar12 = *(long *)((long)GA[lVar1].num_blocks + lVar16 * 2);
            if ((long)iVar15 < lVar12 + -1) {
              lVar24 = pCVar7[lVar24 + 1] + -1;
            }
            else {
              lVar24 = *(long *)((long)GA[lVar1].dims + lVar16 * 2);
            }
            *(long *)((long)local_548 + lVar16 * 2) = lVar24;
            iVar18 = iVar18 + (int)lVar12;
            lVar16 = lVar16 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar16);
        }
      }
      else if (uVar5 == 0) {
        if (GA[lVar1].num_rstrctd == 0) {
          if (0 < (short)uVar4) {
            lVar16 = 1;
            uVar14 = 0;
            do {
              lVar16 = lVar16 * GA[g_a + 1000].nblock[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar28 != uVar14);
            if ((proc < 0) || (lVar16 <= proc)) goto LAB_001924cd;
            if (0 < (short)uVar4) {
              pCVar7 = GA[lVar1].mapc;
              uVar14 = 0;
              lVar16 = 0;
              IVar13 = proc;
              do {
                lVar24 = (long)GA[g_a + 1000].nblock[uVar14];
                lVar12 = IVar13 % lVar24;
                (&local_3a8)[uVar14] = pCVar7[lVar12 + lVar16];
                if (lVar12 == lVar24 + -1) {
                  CVar20 = GA[g_a + 1000].dims[uVar14];
                }
                else {
                  CVar20 = pCVar7[lVar12 + lVar16 + 1] + -1;
                }
                lVar16 = lVar16 + lVar24;
                local_548[uVar14] = CVar20;
                uVar14 = uVar14 + 1;
                IVar13 = IVar13 / lVar24;
              } while (uVar28 != uVar14);
            }
          }
        }
        else if (proc < GA[lVar1].num_rstrctd) {
          if (0 < (short)uVar4) {
            lVar16 = 1;
            uVar14 = 0;
            do {
              lVar16 = lVar16 * GA[g_a + 1000].nblock[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar28 != uVar14);
            if ((proc < 0) || (lVar16 <= proc)) goto LAB_001924cd;
            if (0 < (short)uVar4) {
              pCVar7 = GA[lVar1].mapc;
              lVar16 = 0;
              uVar14 = 0;
              IVar13 = proc;
              do {
                lVar24 = (long)GA[g_a + 1000].nblock[uVar14];
                lVar12 = IVar13 % lVar24;
                (&local_3a8)[uVar14] = pCVar7[lVar12 + lVar16];
                if (lVar12 == lVar24 + -1) {
                  CVar20 = GA[g_a + 1000].dims[uVar14];
                }
                else {
                  CVar20 = pCVar7[lVar12 + lVar16 + 1] + -1;
                }
                lVar16 = lVar16 + lVar24;
                local_548[uVar14] = CVar20;
                uVar14 = uVar14 + 1;
                IVar13 = IVar13 / lVar24;
              } while (uVar28 != uVar14);
            }
          }
        }
        else {
LAB_001924cd:
          if (0 < (short)uVar4) {
            memset(&local_3a8,0,uVar28 * 8);
            memset(local_548,0xff,uVar28 * 8);
          }
        }
      }
      if (uVar28 == 1) {
        local_168[0] = (local_548[0] - local_3a8) + pgVar9[lVar1].width[0] * 2 + 1;
      }
      if ((short)uVar4 < 2) {
        lVar24 = 1;
        lVar16 = 0;
      }
      else {
        lVar24 = 1;
        lVar12 = 0;
        lVar16 = 0;
        do {
          lVar16 = lVar16 + alStack_2a8[lVar12] * lVar24;
          lVar25 = (local_548[lVar12] - (&local_3a8)[lVar12]) +
                   *(long *)((long)pgVar9->dims + lVar12 * 8 + local_568 + -0x30) * 2 + 1;
          local_168[lVar12] = lVar25;
          lVar24 = lVar24 * lVar25;
          lVar12 = lVar12 + 1;
        } while (uVar28 - 1 != lVar12);
      }
      lVar25 = alStack_2a8[uVar28 - 1];
      iVar18 = pgVar9[lVar1].elemsize;
      local_4d8 = (long)iVar18;
      local_4d0 = pgVar9[lVar1].ptr;
      pcVar6 = pgVar9[lVar1].ptr[proc];
      if (local_59c < 3) {
        lVar12 = pgVar9[lVar1].num_blocks[0];
        lVar19 = (long)(int)uVar23 % lVar12;
        local_598[0] = (int)lVar19;
        if (1 < (short)uVar4) {
          lVar29 = 0;
          uVar14 = uVar23;
          do {
            uVar14 = (long)((int)uVar14 - (int)lVar19) / lVar12;
            lVar12 = pgVar9[g_a + 1000].num_blocks[lVar29 + 1];
            lVar19 = (long)(int)uVar14 % lVar12;
            local_598[lVar29 + 1] = (int)lVar19;
            lVar29 = lVar29 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar29);
        }
        if (0 < (short)uVar4) {
          lVar12 = 0;
          do {
            iVar15 = *(int *)((long)local_598 + lVar12);
            lVar19 = *(long *)((long)pgVar9->dims + lVar12 * 2 + local_578 + -0x30);
            *(long *)((long)&local_3a8 + lVar12 * 2) = lVar19 * iVar15 + 1;
            lVar19 = ((long)iVar15 + 1) * lVar19;
            lVar29 = *(long *)((long)pgVar9 + lVar12 * 2 + local_578 + -0x1f8);
            if (lVar29 <= lVar19) {
              lVar19 = lVar29;
            }
            *(long *)((long)local_548 + lVar12 * 2) = lVar19;
            lVar12 = lVar12 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar12);
        }
      }
      else if ((int)local_4e0 == 4) {
        lVar12 = pgVar9[lVar1].num_blocks[0];
        lVar19 = (long)(int)uVar23 % lVar12;
        local_598[0] = (int)lVar19;
        if (1 < (short)uVar4) {
          lVar29 = 0;
          uVar14 = uVar23;
          do {
            uVar14 = (long)((int)uVar14 - (int)lVar19) / lVar12;
            lVar12 = pgVar9[g_a + 1000].num_blocks[lVar29 + 1];
            lVar19 = (long)(int)uVar14 % lVar12;
            local_598[lVar29 + 1] = (int)lVar19;
            lVar29 = lVar29 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar29);
        }
        if (0 < (short)uVar4) {
          pCVar7 = pgVar9[lVar1].mapc;
          lVar12 = 0;
          iVar15 = 0;
          do {
            iVar10 = *(int *)((long)local_598 + lVar12);
            lVar29 = (long)iVar15 + (long)iVar10;
            *(C_Integer *)((long)&local_3a8 + lVar12 * 2) = pCVar7[lVar29];
            lVar19 = *(long *)((long)pgVar9[lVar1].num_blocks + lVar12 * 2);
            if ((long)iVar10 < lVar19 + -1) {
              lVar29 = pCVar7[lVar29 + 1] + -1;
            }
            else {
              lVar29 = *(long *)((long)pgVar9[lVar1].dims + lVar12 * 2);
            }
            *(long *)((long)local_548 + lVar12 * 2) = lVar29;
            iVar15 = iVar15 + (int)lVar19;
            lVar12 = lVar12 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar12);
        }
      }
      else if ((int)local_4e0 == 0) {
        if (pgVar9[lVar1].num_rstrctd == 0) {
          if (0 < (short)uVar4) {
            lVar12 = 1;
            uVar14 = 0;
            do {
              lVar12 = lVar12 * pgVar9[g_a + 1000].nblock[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar28 != uVar14);
            if (((long)uVar23 < 0) || (lVar12 <= (long)uVar23)) {
LAB_0019291f:
              uVar14 = uVar28;
              if (0 < (short)uVar4) goto LAB_0019292c;
            }
            else if (0 < (short)uVar4) {
              pCVar7 = pgVar9[lVar1].mapc;
              lVar12 = 0;
              uVar27 = 0;
              uVar14 = uVar23;
              do {
                lVar29 = (long)pgVar9[g_a + 1000].nblock[uVar27];
                lVar19 = (long)uVar14 % lVar29;
                (&local_3a8)[uVar27] = pCVar7[lVar19 + lVar12];
                if (lVar19 == lVar29 + -1) {
                  CVar20 = pgVar9[g_a + 1000].dims[uVar27];
                }
                else {
                  CVar20 = pCVar7[lVar19 + lVar12 + 1] + -1;
                }
                lVar12 = lVar12 + lVar29;
                local_548[uVar27] = CVar20;
                uVar27 = uVar27 + 1;
                uVar14 = (long)uVar14 / lVar29;
              } while (uVar28 != uVar27);
            }
          }
        }
        else if ((long)uVar23 < pgVar9[lVar1].num_rstrctd) {
          if (0 < (short)uVar4) {
            lVar12 = 1;
            uVar14 = 0;
            do {
              lVar12 = lVar12 * pgVar9[g_a + 1000].nblock[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar28 != uVar14);
            if (((long)uVar23 < 0) || (lVar12 <= (long)uVar23)) goto LAB_0019291f;
            if (0 < (short)uVar4) {
              pCVar7 = pgVar9[lVar1].mapc;
              lVar12 = 0;
              uVar27 = 0;
              uVar14 = uVar23;
              do {
                lVar29 = (long)pgVar9[g_a + 1000].nblock[uVar27];
                lVar19 = (long)uVar14 % lVar29;
                (&local_3a8)[uVar27] = pCVar7[lVar19 + lVar12];
                if (lVar19 == lVar29 + -1) {
                  CVar20 = pgVar9[g_a + 1000].dims[uVar27];
                }
                else {
                  CVar20 = pCVar7[lVar19 + lVar12 + 1] + -1;
                }
                lVar12 = lVar12 + lVar29;
                local_548[uVar27] = CVar20;
                uVar27 = uVar27 + 1;
                uVar14 = (long)uVar14 / lVar29;
              } while (uVar28 != uVar27);
            }
          }
        }
        else if (0 < (short)uVar4) {
          uVar14 = (ulong)uVar4;
LAB_0019292c:
          memset(&local_3a8,0,uVar14 << 3);
          memset(local_548,0xff,uVar14 << 3);
        }
      }
      lVar12 = local_4e8;
      lVar19 = local_4f0;
      if (uVar28 == 1) {
        local_1a8[0] = (local_548[0] - local_3a8) + pgVar9[lVar1].width[0] * 2 + 1;
      }
      if ((short)uVar4 < 2) {
        lVar26 = 1;
        lVar29 = 0;
      }
      else {
        lVar26 = 1;
        lVar29 = 0;
        lVar17 = 0;
        do {
          lVar29 = lVar29 + alStack_130[lVar17 + 1] * lVar26;
          lVar21 = (local_548[lVar17] - (&local_3a8)[lVar17]) +
                   *(long *)((long)pgVar9->dims + lVar17 * 8 + local_568 + -0x30) * 2 + 1;
          local_1a8[lVar17] = lVar21;
          lVar26 = lVar26 * lVar21;
          lVar17 = lVar17 + 1;
        } while (uVar28 - 1 != lVar17);
      }
      lVar17 = alStack_130[uVar28];
      pcVar8 = local_4d0[uVar23];
      local_3c8[0] = local_5a0;
      local_3e8[0] = local_5a0;
      if (1 < sVar3) {
        lVar21 = 0;
        iVar15 = local_5a0;
        iVar10 = local_5a0;
        do {
          iVar15 = iVar15 * (int)local_1a8[lVar21];
          local_3e8[lVar21] = iVar15;
          iVar10 = iVar10 * (int)local_168[lVar21];
          local_3c8[lVar21] = iVar10;
          local_3e8[lVar21 + 1] = iVar15;
          local_3c8[lVar21 + 1] = iVar10;
          lVar21 = lVar21 + 1;
        } while (lVar31 != lVar21);
      }
      if (0 < sVar3) {
        lVar21 = 0;
        do {
          local_408[lVar21] = ((int)alStack_1e8[lVar21] - (int)alStack_2a8[lVar21]) + 1;
          lVar21 = lVar21 + 1;
        } while (lVar30 != lVar21);
      }
      local_408[0] = local_408[0] * local_5a0;
      if (-1 < (int)local_558) {
        uVar23 = (ulong)(uint)PGRP_LIST[local_558].inv_map_proc_list[uVar23];
      }
      ARMCI_GetS(pcVar8 + (lVar26 * lVar17 + lVar29) * local_4d8,local_3e8,
                 pcVar6 + (lVar24 * lVar25 + lVar16) * (long)iVar18,local_3c8,local_408,(int)lVar31,
                 (int)uVar23);
      local_5b8 = local_5b8 + 1;
    } while (local_5b8 != lVar19);
    if (local_5a4 != 0) {
      pnga_pgroup_sync(local_558);
    }
    free(local_560);
    free(proclist);
  }
  return 1;
}

Assistant:

logical pnga_update_ghost_dir(Integer g_a,    /* GA handle */
                                   Integer pdim,   /* Dimension of update */
                                   Integer pdir,   /* Direction of update (+/-1) */
                                   logical pflag)  /* include corner cells */
{
  Integer idx, ipx, inx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM],lmask[MAXDIM];
  Integer size, ndim, i, itmp, idim, idir;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM]/*, phi_rem[MAXDIM]*/;
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) 
    return TRUE;
  
  p_handle = GA[handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(p_handle);
  idim = pdim;
  idir = pdir;
  flag = pflag;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
  _ga_proclist = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of GET operations */
  ntot = 1;
  if (flag) {
    for (idx=0; idx < ndim-1; idx++) ntot *= 3;
  }

  /* Loop over all GET operations. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    if (flag) {
      itmp = ipx;
      for (idx = 0; idx < ndim-1; idx++) {
        i = itmp%3;
        lmask[idx] = i-1;
        itmp = (itmp-i)/3;
      }
    } else {
      for (idx = 0; idx < ndim-1; idx++) lmask[idx] = 0;
    }
    inx = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (idx == idim-1) {
        mask[idx] = idir;
      } else {
        mask[idx] = lmask[inx];
        inx++;
      }
    }
    /* Now that mask has been determined, find processor that contains
     * data needed by the corresponding block of ghost cells */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to get
       data from it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
        /*phi_rem[idx] = phi_loc[idx];*/
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
        /*phi_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx];*/
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
        /*phi_rem[idx] = 2*width[idx]-1;*/
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* get data from remote processor */
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem);
  }

  if(local_sync_end)pnga_pgroup_sync(p_handle);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}